

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O2

void __thiscall
QSortFilterProxyModelPrivate::source_items_inserted
          (QSortFilterProxyModelPrivate *this,QModelIndex *source_parent,int start,int end,
          Direction direction)

{
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  *this_00;
  QObject *this_01;
  QAbstractItemModel *pQVar1;
  Span *pSVar2;
  long lVar3;
  long lVar4;
  Mapping *parent_mapping;
  qsizetype qVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Mapping *proxy_to_source;
  bool bVar8;
  char cVar9;
  int iVar10;
  uint uVar11;
  Mapping *proxy_to_source_00;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  QList<int> *this_02;
  QList<int> *this_03;
  ulong i_00;
  int i;
  long in_FS_OFFSET;
  const_iterator cVar15;
  QMessageLogger local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < (end | start)) {
    this_01 = (this->super_QAbstractProxyModelPrivate).super_QAbstractItemModelPrivate.
              super_QObjectPrivate.super_QObjectData.q_ptr;
    pQVar1 = (source_parent->m).ptr;
    local_58.context.function._0_4_ = SUB84(pQVar1,0);
    local_58.context.function._4_4_ = (undefined4)((ulong)pQVar1 >> 0x20);
    uVar6 = source_parent->r;
    uVar7 = source_parent->c;
    local_58.context.file._0_4_ = (undefined4)source_parent->i;
    local_58.context.file._4_4_ = (undefined4)(source_parent->i >> 0x20);
    local_58.context.version = uVar6;
    local_58.context.line = uVar7;
    cVar15 = QHash<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>::
             constFindImpl<QtPrivate::QModelIndexWrapper>
                       (&this->source_index_mapping,(QModelIndexWrapper *)&local_58);
    if (cVar15.i.d ==
        (Data<QHashPrivate::Node<QtPrivate::QModelIndexWrapper,_QSortFilterProxyModelPrivate::Mapping_*>_>
         *)0x0 && cVar15.i.bucket == 0) {
      bVar8 = can_create_mapping(this,source_parent);
      if (bVar8) {
        cVar15 = create_mapping(this,source_parent);
        pSVar2 = (cVar15.i.d)->spans;
        uVar12 = cVar15.i.bucket >> 7;
        lVar3 = *(long *)(pSVar2[uVar12].entries
                          [pSVar2[uVar12].offsets[(uint)cVar15.i.bucket & 0x7f]].storage.data + 0x18
                         );
        local_58.context.function._0_4_ = 0xaaaaaaaa;
        local_58.context.function._4_4_ = 0xaaaaaaaa;
        local_58.context.version = -0x55555556;
        local_58.context.line = -0x55555556;
        local_58.context.file._0_4_ = 0xaaaaaaaa;
        local_58.context.file._4_4_ = 0xaaaaaaaa;
        (*this_01->_vptr_QObject[0x33])(&local_58,this_01,source_parent);
        lVar4 = *(long *)(lVar3 + 0x10);
        if (lVar4 != 0) {
          QAbstractItemModel::beginInsertRows
                    ((QAbstractItemModel *)this_01,(QModelIndex *)&local_58,0,(int)lVar4 + -1);
          QAbstractItemModel::endInsertRows((QAbstractItemModel *)this_01);
        }
        lVar3 = *(long *)(lVar3 + 0x28);
        if (lVar3 != 0) {
          QAbstractItemModel::beginInsertColumns
                    ((QAbstractItemModel *)this_01,(QModelIndex *)&local_58,0,(int)lVar3 + -1);
          QAbstractItemModel::endInsertColumns((QAbstractItemModel *)this_01);
        }
      }
    }
    else {
      pSVar2 = (cVar15.i.d)->spans;
      uVar12 = cVar15.i.bucket >> 7;
      parent_mapping =
           *(Mapping **)
            (pSVar2[uVar12].entries[pSVar2[uVar12].offsets[(uint)cVar15.i.bucket & 0x7f]].storage.
             data + 0x18);
      this_03 = &parent_mapping->proxy_columns;
      if (direction == Rows) {
        this_03 = &parent_mapping->proxy_rows;
      }
      proxy_to_source_00 = (Mapping *)&parent_mapping->source_columns;
      if (direction == Rows) {
        proxy_to_source_00 = parent_mapping;
      }
      iVar13 = (end - start) + 1;
      qVar5 = (this_03->d).size;
      updateChildrenMapping(this,source_parent,parent_mapping,direction,start,end,iVar13,false);
      if ((ulong)(this_03->d).size < (ulong)(uint)start) {
        local_58.context.version = 2;
        local_58.context.function._4_4_ = 0;
        local_58.context.line = 0;
        local_58.context.file._0_4_ = 0;
        local_58.context.file._4_4_ = 0;
        local_58.context.function._0_4_ = 0;
        local_58.context.category = "default";
        QMessageLogger::warning
                  (&local_58,"QSortFilterProxyModel: invalid inserted rows reported by source model"
                  );
        remove_from_mapping(this,source_parent);
      }
      else {
        QList<int>::insert(this_03,(ulong)(uint)start,(long)iVar13,-1);
        if (start < (int)qVar5) {
          uVar14 = (uint)(proxy_to_source_00->source_rows).d.size;
          i_00 = 0;
          uVar12 = (ulong)uVar14;
          if ((int)uVar14 < 1) {
            uVar12 = i_00;
          }
          for (; uVar12 != i_00; i_00 = i_00 + 1) {
            iVar10 = (proxy_to_source_00->source_rows).d.ptr[i_00];
            if (start <= iVar10) {
              QList<int>::replace(&proxy_to_source_00->source_rows,i_00,iVar10 + iVar13);
            }
          }
          build_source_to_proxy_mapping(&proxy_to_source_00->source_rows,this_03,0);
        }
        local_58.context.version = 0;
        local_58.context.line = 0;
        local_58.context.file._0_4_ = 0;
        local_58.context.file._4_4_ = 0;
        local_58.context.function._0_4_ = 0;
        local_58.context.function._4_4_ = 0;
        for (; start <= end; start = start + 1) {
          if (direction == Rows) {
            cVar9 = filterAcceptsRowInternal(this,start,source_parent);
          }
          else {
            iVar10 = (*this_01->_vptr_QObject[0x37])(this_01,(ulong)(uint)start,source_parent);
            cVar9 = (char)iVar10;
          }
          if (cVar9 != '\0') {
            QList<int>::append((QList<int> *)&local_58,start);
          }
        }
        this_00 = &(this->super_QAbstractProxyModelPrivate).model;
        QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
        ::value(this_00);
        pQVar1 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
        iVar10 = (*(pQVar1->super_QObject)._vptr_QObject[0xf])(pQVar1,source_parent);
        if (iVar10 == iVar13) {
          this_02 = &parent_mapping->proxy_columns;
          proxy_to_source = (Mapping *)&parent_mapping->source_columns;
          if (direction == Columns) {
            this_02 = &parent_mapping->proxy_rows;
            proxy_to_source = parent_mapping;
          }
          if ((this_02->d).size == 0) {
            QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
            ::value(this_00);
            pQVar1 = (this_00->super_QPropertyData<QAbstractItemModel_*>).val;
            uVar11 = (*(pQVar1->super_QObject)._vptr_QObject[(ulong)(direction != Columns) + 0xf])
                               (pQVar1,source_parent);
            QList<int>::resize(this_02,(long)(int)uVar11);
            uVar14 = 0;
            if ((int)uVar11 < 1) {
              uVar11 = 0;
              uVar14 = 0;
            }
            for (; uVar11 != uVar14; uVar14 = uVar14 + 1) {
              if (direction == Columns) {
                cVar9 = filterAcceptsRowInternal(this,uVar14,source_parent);
              }
              else {
                iVar13 = (*this_01->_vptr_QObject[0x37])(this_01,(ulong)uVar14,source_parent);
                cVar9 = (char)iVar13;
              }
              if (cVar9 != '\0') {
                QList<int>::append(&proxy_to_source->source_rows,uVar14);
              }
            }
            if (direction == Columns) {
              sort_source_rows(this,&parent_mapping->source_rows,source_parent);
            }
            build_source_to_proxy_mapping(&proxy_to_source->source_rows,this_02,0);
          }
        }
        if (direction == Rows) {
          sort_source_rows(this,(QList<int> *)&local_58,source_parent);
        }
        insert_source_items(this,this_03,&proxy_to_source_00->source_rows,(QList<int> *)&local_58,
                            source_parent,direction,true);
        QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_58);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSortFilterProxyModelPrivate::source_items_inserted(
    const QModelIndex &source_parent, int start, int end, Direction direction)
{
    Q_Q(QSortFilterProxyModel);
    if ((start < 0) || (end < 0))
        return;
    IndexMap::const_iterator it = source_index_mapping.constFind(source_parent);
    if (it == source_index_mapping.constEnd()) {
        if (!can_create_mapping(source_parent))
            return;
        it = create_mapping(source_parent);
        Mapping *m = it.value();
        QModelIndex proxy_parent = q->mapFromSource(source_parent);
        if (m->source_rows.size() > 0) {
            q->beginInsertRows(proxy_parent, 0, m->source_rows.size() - 1);
            q->endInsertRows();
        }
        if (m->source_columns.size() > 0) {
            q->beginInsertColumns(proxy_parent, 0, m->source_columns.size() - 1);
            q->endInsertColumns();
        }
        return;
    }

    Mapping *m = it.value();
    QList<int> &source_to_proxy = (direction == Direction::Rows) ? m->proxy_rows : m->proxy_columns;
    QList<int> &proxy_to_source = (direction == Direction::Rows) ? m->source_rows : m->source_columns;

    int delta_item_count = end - start + 1;
    int old_item_count = source_to_proxy.size();

    updateChildrenMapping(source_parent, m, direction, start, end, delta_item_count, false);

    // Expand source-to-proxy mapping to account for new items
    if (start < 0 || start > source_to_proxy.size()) {
        qWarning("QSortFilterProxyModel: invalid inserted rows reported by source model");
        remove_from_mapping(source_parent);
        return;
    }
    source_to_proxy.insert(start, delta_item_count, -1);

    if (start < old_item_count) {
        // Adjust existing "stale" indexes in proxy-to-source mapping
        int proxy_count = proxy_to_source.size();
        for (int proxy_item = 0; proxy_item < proxy_count; ++proxy_item) {
            int source_item = proxy_to_source.at(proxy_item);
            if (source_item >= start)
                proxy_to_source.replace(proxy_item, source_item + delta_item_count);
        }
        build_source_to_proxy_mapping(proxy_to_source, source_to_proxy);
    }

    // Figure out which items to add to mapping based on filter
    QList<int> source_items;
    for (int i = start; i <= end; ++i) {
        if ((direction == Direction::Rows)
            ? filterAcceptsRowInternal(i, source_parent)
            : q->filterAcceptsColumn(i, source_parent)) {
            source_items.append(i);
        }
    }

    if (model->rowCount(source_parent) == delta_item_count) {
        // Items were inserted where there were none before.
        // If it was new rows make sure to create mappings for columns so that a
        // valid mapping can be retrieved later and vice-versa.

        QList<int> &orthogonal_proxy_to_source = (direction == Direction::Columns) ? m->source_rows : m->source_columns;
        QList<int> &orthogonal_source_to_proxy = (direction == Direction::Columns) ? m->proxy_rows : m->proxy_columns;

        if (orthogonal_source_to_proxy.isEmpty()) {
            const int ortho_end = (direction == Direction::Columns) ? model->rowCount(source_parent) : model->columnCount(source_parent);

            orthogonal_source_to_proxy.resize(ortho_end);

            for (int ortho_item = 0; ortho_item < ortho_end; ++ortho_item) {
                if ((direction == Direction::Columns) ? filterAcceptsRowInternal(ortho_item, source_parent)
                        : q->filterAcceptsColumn(ortho_item, source_parent)) {
                    orthogonal_proxy_to_source.append(ortho_item);
                }
            }
            if (direction == Direction::Columns) {
                // We're reacting to columnsInserted, but we've just inserted new rows. Sort them.
                sort_source_rows(orthogonal_proxy_to_source, source_parent);
            }
            build_source_to_proxy_mapping(orthogonal_proxy_to_source, orthogonal_source_to_proxy);
        }
    }

    // Sort and insert the items
    if (direction == Direction::Rows) // Only sort rows
        sort_source_rows(source_items, source_parent);
    insert_source_items(source_to_proxy, proxy_to_source, source_items, source_parent, direction);
}